

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void(std::error_code_const&)>::
callback<cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,cppcms::impl::cgi::http_creator>::accept_binder>
          (callback<void(std::error_code_const&)> *this,accept_binder func)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__refcounted_00284bd0;
  booster::atomic_counter::atomic_counter((atomic_counter *)(puVar1 + 1),0);
  *puVar1 = &PTR__refcounted_0028b100;
  puVar1[2] = func.self;
  *(undefined8 **)this = puVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}